

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O3

string * __thiscall
YAML::Exp::Escape_abi_cxx11_(string *__return_storage_ptr__,Exp *this,Stream *in,int codeLength)

{
  size_type *psVar1;
  ulong *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 *puVar5;
  Exception *this_00;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string str;
  stringstream msg;
  string local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  int local_250;
  undefined4 uStack_24c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  paVar4 = &local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar4;
  if (0 < (int)in) {
    uVar7 = (ulong)in & 0xffffffff;
    do {
      YAML::Stream::get((Stream *)this);
      std::__cxx11::string::push_back((char)&local_1d8);
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  local_1b8._0_8_ = *(undefined8 *)(this + 8);
  local_1b8._8_4_ = *(undefined4 *)(this + 0x10);
  uVar6 = ParseHex(&local_1d8,(Mark *)local_1b8);
  if ((0x10ffff < uVar6) || ((uVar6 & 0xfffff800) == 0xd800)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8[0]._M_local_buf,"invalid unicode: ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    this_00 = (Exception *)__cxa_allocate_exception(0x40);
    local_258 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(this + 8);
    local_250 = *(int *)(this + 0x10);
    std::__cxx11::stringbuf::str();
    Exception::Exception(this_00,(Mark *)&local_258,&local_278);
    *(undefined ***)this_00 = &PTR__BadFile_008779d0;
    __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
  }
  if (uVar6 < 0x80) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
    goto LAB_0070d05f;
  }
  if (uVar6 < 0x800) {
    paVar11 = local_1a8;
    local_1b8._0_8_ = paVar11;
    std::__cxx11::string::_M_construct((ulong)local_1b8,'\x01');
    paVar3 = &local_278.field_2;
    local_278._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct((ulong)&local_278,'\x01');
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar11) {
      uVar10 = local_1a8[0]._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_278._M_string_length + local_1b8._8_8_) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar3) {
        uVar10 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_278._M_string_length + local_1b8._8_8_) goto LAB_0070cc6e;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,local_1b8._0_8_);
    }
    else {
LAB_0070cc6e:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append(local_1b8,(ulong)local_278._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar1) {
      uVar10 = puVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    __return_storage_ptr__->_M_string_length = puVar5[1];
    *puVar5 = psVar1;
    puVar5[1] = 0;
    *(undefined1 *)psVar1 = 0;
    _Var9._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar3) {
      operator_delete(local_278._M_dataplus._M_p);
      _Var9._M_p = (pointer)local_1b8._0_8_;
    }
LAB_0070d055:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == paVar11) goto LAB_0070d05f;
  }
  else {
    if (uVar6 < 0x10000) {
      paVar11 = &local_278.field_2;
      local_278._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct((ulong)&local_278,'\x01');
      local_258 = &local_248;
      std::__cxx11::string::_M_construct((ulong)&local_258,'\x01');
      uVar7 = CONCAT44(uStack_24c,local_250) + local_278._M_string_length;
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar11) {
        uVar10 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < uVar7) {
        uVar10 = 0xf;
        if (local_258 != &local_248) {
          uVar10 = local_248._M_allocated_capacity;
        }
        if ((ulong)uVar10 < uVar7) goto LAB_0070cd11;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_258,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_0070cd11:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
      }
      local_1b8._0_8_ = local_1a8;
      puVar2 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2) {
        local_1a8[0]._0_8_ = *puVar2;
        local_1a8[0]._8_8_ = puVar5[3];
      }
      else {
        local_1a8[0]._0_8_ = *puVar2;
        local_1b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar5;
      }
      local_1b8._8_8_ = puVar5[1];
      *puVar5 = puVar2;
      puVar5[1] = 0;
      *(undefined1 *)puVar2 = 0;
      local_238 = local_228;
      std::__cxx11::string::_M_construct((ulong)&local_238,'\x01');
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        uVar10 = local_1a8[0]._M_allocated_capacity;
      }
      if ((ulong)uVar10 < (ulong)(local_230 + local_1b8._8_8_)) {
        uVar7 = 0xf;
        if (local_238 != local_228) {
          uVar7 = local_228[0];
        }
        if (uVar7 < (ulong)(local_230 + local_1b8._8_8_)) goto LAB_0070ceef;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,local_1b8._0_8_);
      }
      else {
LAB_0070ceef:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_1b8,(ulong)local_238);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar1 = puVar5 + 2;
      if ((size_type *)*puVar5 == psVar1) {
        uVar10 = puVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      }
      __return_storage_ptr__->_M_string_length = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_238 != local_228) {
        operator_delete(local_238);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_);
      }
      _Var9._M_p = local_278._M_dataplus._M_p;
      if (local_258 != &local_248) {
        operator_delete(local_258);
        _Var9._M_p = local_278._M_dataplus._M_p;
      }
      goto LAB_0070d055;
    }
    local_258 = &local_248;
    std::__cxx11::string::_M_construct((ulong)&local_258,'\x01');
    local_238 = local_228;
    std::__cxx11::string::_M_construct((ulong)&local_238,'\x01');
    uVar7 = local_230 + CONCAT44(uStack_24c,local_250);
    uVar10 = 0xf;
    if (local_258 != &local_248) {
      uVar10 = local_248._M_allocated_capacity;
    }
    if ((ulong)uVar10 < uVar7) {
      uVar8 = 0xf;
      if (local_238 != local_228) {
        uVar8 = local_228[0];
      }
      if (uVar8 < uVar7) goto LAB_0070cda6;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_258);
    }
    else {
LAB_0070cda6:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_238);
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    puVar2 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2) {
      local_278.field_2._M_allocated_capacity = *puVar2;
      local_278.field_2._8_8_ = puVar5[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = *puVar2;
      local_278._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_278._M_string_length = puVar5[1];
    *puVar5 = puVar2;
    puVar5[1] = 0;
    *(undefined1 *)puVar2 = 0;
    local_218 = local_208;
    std::__cxx11::string::_M_construct((ulong)&local_218,'\x01');
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar10 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_210 + local_278._M_string_length) {
      uVar7 = 0xf;
      if (local_218 != local_208) {
        uVar7 = local_208[0];
      }
      if (uVar7 < local_210 + local_278._M_string_length) goto LAB_0070cfc5;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_218,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
    }
    else {
LAB_0070cfc5:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218);
    }
    local_1b8._0_8_ = local_1a8;
    puVar2 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2) {
      local_1a8[0]._0_8_ = *puVar2;
      local_1a8[0]._8_8_ = puVar5[3];
    }
    else {
      local_1a8[0]._0_8_ = *puVar2;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar5;
    }
    local_1b8._8_8_ = puVar5[1];
    *puVar5 = puVar2;
    puVar5[1] = 0;
    *(undefined1 *)puVar2 = 0;
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x01');
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != local_1a8) {
      uVar10 = local_1a8[0]._M_allocated_capacity;
    }
    if ((ulong)uVar10 < (ulong)(local_1f0 + local_1b8._8_8_)) {
      uVar7 = 0xf;
      if (local_1f8 != local_1e8) {
        uVar7 = local_1e8[0];
      }
      if (uVar7 < (ulong)(local_1f0 + local_1b8._8_8_)) goto LAB_0070d163;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,local_1b8._0_8_);
    }
    else {
LAB_0070d163:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_1b8,(ulong)local_1f8);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar1) {
      uVar10 = puVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    __return_storage_ptr__->_M_string_length = puVar5[1];
    *puVar5 = psVar1;
    puVar5[1] = 0;
    *(undefined1 *)psVar1 = 0;
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if (local_238 != local_228) {
      operator_delete(local_238);
    }
    _Var9._M_p = (pointer)local_258;
    if (local_258 == &local_248) goto LAB_0070d05f;
  }
  operator_delete(_Var9._M_p);
LAB_0070d05f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Escape(Stream& in, int codeLength) {
  // grab string
  std::string str;
  for (int i = 0; i < codeLength; i++)
    str += in.get();

  // get the value
  unsigned value = ParseHex(str, in.mark());

  // legal unicode?
  if ((value >= 0xD800 && value <= 0xDFFF) || value > 0x10FFFF) {
    std::stringstream msg;
    msg << ErrorMsg::INVALID_UNICODE << value;
    throw ParserException(in.mark(), msg.str());
  }

  // now break it up into chars
  if (value <= 0x7F)
    return Str(value);

  if (value <= 0x7FF)
    return Str(0xC0 + (value >> 6)) + Str(0x80 + (value & 0x3F));

  if (value <= 0xFFFF)
    return Str(0xE0 + (value >> 12)) + Str(0x80 + ((value >> 6) & 0x3F)) +
           Str(0x80 + (value & 0x3F));

  return Str(0xF0 + (value >> 18)) + Str(0x80 + ((value >> 12) & 0x3F)) +
         Str(0x80 + ((value >> 6) & 0x3F)) + Str(0x80 + (value & 0x3F));
}